

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

void alGetIntegerv(ALenum param,ALint *values)

{
  uint32 x;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alGetIntegerv);
  writele32(param);
  IO_UINT64((uint64)values);
  x = (uint32)(values != (ALint *)0x0 && param == 0xd000);
  if (values != (ALint *)0x0 && param == 0xd000) {
    *values = 0;
    (*REAL_alGetIntegerv)(param,values);
    writele32(x);
    x = *values;
  }
  else {
    (*REAL_alGetIntegerv)(param,values);
  }
  writele32(x);
  check_al_error_events();
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alGetIntegerv(ALenum param, ALint *values)
{
    uint32 numvals = 0;
    uint32 i;
    IO_START(alGetIntegerv);
    IO_ENUM(param);
    IO_PTR(values);

    switch (param) {
        case AL_DISTANCE_MODEL: numvals = 1;
        default: break;
    }
    if (!values) { numvals = 0; }
    if (numvals) {
        memset(values, '\0', numvals * sizeof (ALint));
    }
    REAL_alGetIntegerv(param, values);
    IO_UINT32(numvals);
    for (i = 0; i < numvals; i++) {
        IO_INT32(values[i]);
    }
    IO_END();
}